

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

void __thiscall
wallet::SQLiteDatabase::SQLiteDatabase
          (SQLiteDatabase *this,path *dir_path,path *file_path,DatabaseOptions *options,bool mock)

{
  int iVar1;
  runtime_error *prVar2;
  char **args;
  uint uVar3;
  long in_FS_OFFSET;
  bool bVar4;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  char *in_stack_ffffffffffffff90;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock0;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_WalletDatabase).m_refcount = (__atomic_base<int>)0x0;
  (this->super_WalletDatabase).nUpdateCounter = (__atomic_base<unsigned_int>)0x0;
  (this->super_WalletDatabase).nLastSeen = 0;
  (this->super_WalletDatabase).nLastFlushed = 0;
  (this->super_WalletDatabase).nLastWalletUpdate = 0;
  (this->super_WalletDatabase)._vptr_WalletDatabase = (_func_int **)&PTR__SQLiteDatabase_00a27158;
  this->m_mock = mock;
  std::filesystem::__cxx11::path::string(&this->m_dir_path,&dir_path->super_path);
  std::filesystem::__cxx11::path::string(&this->m_file_path,&file_path->super_path);
  CSemaphore::CSemaphore(&this->m_write_semaphore,1);
  this->m_db = (sqlite3 *)0x0;
  this->m_use_unsafe_sync = options->use_unsafe_sync;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock0,(AnnotatedMixin<std::mutex> *)g_sqlite_mutex,"g_sqlite_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
             ,0x76,false);
  SQLiteDatabaseVersion_abi_cxx11_();
  source_file._M_str =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp";
  source_file._M_len = 0x5a;
  logging_function._M_str = "SQLiteDatabase";
  logging_function._M_len = 0xe;
  ::LogPrintf_<std::__cxx11::string>
            (logging_function,source_file,0x77,
             I2P|VALIDATION|QT|COINDB|LIBEVENT|MEMPOOLREJ|PROXY|PRUNE|RAND|REINDEX|SELECTCOINS|
             ESTIMATEFEE|WALLETDB|MEMPOOL|NET,(Level)&local_58,in_stack_ffffffffffffff90,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             criticalblock0.super_unique_lock._M_device);
  std::__cxx11::string::~string((string *)&local_58);
  source_file_00._M_str =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp";
  source_file_00._M_len = 0x5a;
  logging_function_00._M_str = "SQLiteDatabase";
  logging_function_00._M_len = 0xe;
  ::LogPrintf_<std::__cxx11::string>
            (logging_function_00,source_file_00,0x78,
             I2P|VALIDATION|QT|COINDB|LIBEVENT|MEMPOOLREJ|PROXY|PRUNE|RAND|REINDEX|SELECTCOINS|
             ESTIMATEFEE|WALLETDB|BENCH|HTTP|MEMPOOL|TOR,(Level)&this->m_dir_path,
             in_stack_ffffffffffffff90,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             criticalblock0.super_unique_lock._M_device);
  args = (char **)(ulong)g_sqlite_count;
  uVar3 = g_sqlite_count + 1;
  bVar4 = g_sqlite_count == 0;
  g_sqlite_count = uVar3;
  if (bVar4) {
    iVar1 = sqlite3_config(0x10,ErrorLogCallback,0);
    if (iVar1 != 0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      sqlite3_errstr(iVar1);
      tinyformat::format<char_const*>
                (&local_58,(tinyformat *)"SQLiteDatabase: Failed to setup error log: %s\n",
                 &stack0xffffffffffffff90,args);
      std::runtime_error::runtime_error(prVar2,(string *)&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_004a352c;
    }
    iVar1 = sqlite3_config(3);
    if (iVar1 != 0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      sqlite3_errstr(iVar1);
      tinyformat::format<char_const*>
                (&local_58,
                 (tinyformat *)"SQLiteDatabase: Failed to configure serialized threading mode: %s\n"
                 ,&stack0xffffffffffffff90,args);
      std::runtime_error::runtime_error(prVar2,(string *)&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_004a352c;
    }
  }
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    std::unique_lock<std::mutex>::~unique_lock(&criticalblock0.super_unique_lock);
    (*(this->super_WalletDatabase)._vptr_WalletDatabase[2])(this);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    sqlite3_errstr(iVar1);
    tinyformat::format<char_const*>
              (&local_58,(tinyformat *)"SQLiteDatabase: Failed to initialize SQLite: %s\n",
               &stack0xffffffffffffff90,args);
    std::runtime_error::runtime_error(prVar2,(string *)&local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
LAB_004a352c:
  __stack_chk_fail();
}

Assistant:

SQLiteDatabase::SQLiteDatabase(const fs::path& dir_path, const fs::path& file_path, const DatabaseOptions& options, bool mock)
    : WalletDatabase(), m_mock(mock), m_dir_path(fs::PathToString(dir_path)), m_file_path(fs::PathToString(file_path)), m_write_semaphore(1), m_use_unsafe_sync(options.use_unsafe_sync)
{
    {
        LOCK(g_sqlite_mutex);
        LogPrintf("Using SQLite Version %s\n", SQLiteDatabaseVersion());
        LogPrintf("Using wallet %s\n", m_dir_path);

        if (++g_sqlite_count == 1) {
            // Setup logging
            int ret = sqlite3_config(SQLITE_CONFIG_LOG, ErrorLogCallback, nullptr);
            if (ret != SQLITE_OK) {
                throw std::runtime_error(strprintf("SQLiteDatabase: Failed to setup error log: %s\n", sqlite3_errstr(ret)));
            }
            // Force serialized threading mode
            ret = sqlite3_config(SQLITE_CONFIG_SERIALIZED);
            if (ret != SQLITE_OK) {
                throw std::runtime_error(strprintf("SQLiteDatabase: Failed to configure serialized threading mode: %s\n", sqlite3_errstr(ret)));
            }
        }
        int ret = sqlite3_initialize(); // This is a no-op if sqlite3 is already initialized
        if (ret != SQLITE_OK) {
            throw std::runtime_error(strprintf("SQLiteDatabase: Failed to initialize SQLite: %s\n", sqlite3_errstr(ret)));
        }
    }

    try {
        Open();
    } catch (const std::runtime_error&) {
        // If open fails, cleanup this object and rethrow the exception
        Cleanup();
        throw;
    }
}